

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_func_t *
wasm_func_new_with_env
          (wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_with_env_t callback,
          void *env,_func_void_void_ptr *finalizer)

{
  ExternType *pEVar1;
  wasm_func_t *this;
  _func_void *p_Var2;
  FuncType wabt_type;
  anon_class_88_4_3c8b320e lambda;
  RefPtr<wabt::interp::HostFunc> local_168;
  RefPtr<wabt::interp::Func> local_148;
  wasm_func_callback_with_env_t local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  FuncType local_108;
  undefined **local_c8;
  ExternKind local_c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_a0;
  wasm_store_t *local_88;
  undefined **local_80;
  ExternKind local_78;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_70;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  wasm_func_callback_with_env_t local_40;
  void *pvStack_38;
  
  pEVar1 = (type->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_130 = callback;
  if (pEVar1->kind == First) {
    local_c0 = First;
    local_c8 = &PTR__FuncType_001e48a0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_b8,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar1 + 1));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_a0,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar1[2].kind);
    local_78 = local_c0;
    local_80 = &PTR__FuncType_001e48a0;
    local_88 = store;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_70,&local_b8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_58,&local_a0);
    local_40 = local_130;
    pvStack_38 = env;
    this = (wasm_func_t *)operator_new(0x18);
    local_108.super_ExternType.kind = local_c0;
    local_108.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e48a0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_108.params,&local_b8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_108.results,&local_a0);
    local_128._8_8_ = 0;
    p_Var2 = (_func_void *)operator_new(0x58);
    *(wasm_store_t **)p_Var2 = local_88;
    *(ExternKind *)(p_Var2 + 0x10) = local_78;
    *(undefined ***)(p_Var2 + 8) = &PTR__FuncType_001e48a0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x18),&local_70);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var2 + 0x30),&local_58);
    *(wasm_func_callback_with_env_t *)(p_Var2 + 0x48) = local_40;
    *(void **)(p_Var2 + 0x50) = pvStack_38;
    local_110 = std::
                _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:762:17)>
                ::_M_invoke;
    local_118 = std::
                _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:762:17)>
                ::_M_manager;
    local_128._M_unused._0_8_ = (undefined8)p_Var2;
    wabt::interp::Store::
    Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
              (&local_168,&store->I,&store->I,&local_108,
               (function<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                *)&local_128);
    local_148.obj_ = &(local_168.obj_)->super_Func;
    local_148.store_ = local_168.store_;
    if (local_168.store_ == (Store *)0x0) {
      local_148.root_index_ = 0;
    }
    else {
      local_148.root_index_ = wabt::interp::Store::CopyRoot(local_168.store_,local_168.root_index_);
    }
    wasm_func_t::wasm_func_t(this,&local_148);
    if ((HostFunc *)local_148.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_148.store_,local_148.root_index_);
      local_148.obj_ = (Func *)0x0;
      local_148.store_ = (Store *)0x0;
      local_148.root_index_ = 0;
    }
    if (local_168.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_168.store_,local_168.root_index_);
      local_168.obj_ = (HostFunc *)0x0;
      local_168.store_ = (Store *)0x0;
      local_168.root_index_ = 0;
    }
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    local_108.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e48a0;
    if (local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_80 = &PTR__FuncType_001e48a0;
    if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_c8 = &PTR__FuncType_001e48a0;
    if (local_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_func_t* wasm_func_new_with_env(wasm_store_t* store,
                                        const wasm_functype_t* type,
                                        wasm_func_callback_with_env_t callback,
                                        void* env,
                                        void (*finalizer)(void*)) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](const Values& wabt_params, Values& wabt_results,
                    Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, params.data, wabt_type.params, wabt_params);
    auto trap = callback(env, params.data, results.data);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(results.data, results.size);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  // TODO: This finalizer is different from the host_info finalizer.
  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}